

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int CVodeQuadInit(void *cvode_mem,CVQuadRhsFn fQ,N_Vector yQ0)

{
  int iVar1;
  undefined8 in_RDX;
  CVQuadRhsFn in_RSI;
  CVodeMem in_RDI;
  sunindextype liw1Q;
  sunindextype lrw1Q;
  int allocOK;
  CVodeMem cv_mem;
  N_Vector in_stack_ffffffffffffffc0;
  CVodeMem in_stack_ffffffffffffffc8;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x48e,"CVodeQuadInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    N_VSpace(in_RDX,&stack0xffffffffffffffc8,&stack0xffffffffffffffc0);
    in_RDI->cv_lrw1Q = (sunindextype)in_stack_ffffffffffffffc8;
    in_RDI->cv_liw1Q = (sunindextype)in_stack_ffffffffffffffc0;
    iVar1 = cvQuadAllocVectors(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (iVar1 == 0) {
      cvProcessError(in_RDI,-0x14,0x49c,"CVodeQuadInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                     ,"A memory request failed.");
      local_4 = -0x14;
    }
    else {
      N_VScale(0x3ff0000000000000,in_RDX,in_RDI->cv_znQ[0]);
      in_RDI->cv_fQ = in_RSI;
      in_RDI->cv_nfQe = 0;
      in_RDI->cv_netfQ = 0;
      in_RDI->cv_quadr = 1;
      in_RDI->cv_QuadMallocDone = 1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CVodeQuadInit(void* cvode_mem, CVQuadRhsFn fQ, N_Vector yQ0)
{
  CVodeMem cv_mem;
  sunbooleantype allocOK;
  sunindextype lrw1Q, liw1Q;

  /* Check cvode_mem */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Set space requirements for one N_Vector */
  N_VSpace(yQ0, &lrw1Q, &liw1Q);
  cv_mem->cv_lrw1Q = lrw1Q;
  cv_mem->cv_liw1Q = liw1Q;

  /* Allocate the vectors (using yQ0 as a template) */
  allocOK = cvQuadAllocVectors(cv_mem, yQ0);
  if (!allocOK)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  /* Initialize znQ[0] in the history array */
  N_VScale(ONE, yQ0, cv_mem->cv_znQ[0]);

  /* Copy the input parameters into CVODES state */
  cv_mem->cv_fQ = fQ;

  /* Initialize counters */
  cv_mem->cv_nfQe  = 0;
  cv_mem->cv_netfQ = 0;

  /* Quadrature integration turned ON */
  cv_mem->cv_quadr          = SUNTRUE;
  cv_mem->cv_QuadMallocDone = SUNTRUE;

  /* Quadrature initialization was successful */
  return (CV_SUCCESS);
}